

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::setVolumeMass(btSoftBody *this,btScalar mass)

{
  uint uVar1;
  Node *pNVar2;
  Tetra *pTVar3;
  Node *pNVar4;
  int iVar5;
  btScalar *pbVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  Node **ppNVar10;
  int j;
  long lVar11;
  float local_44;
  btAlignedObjectArray<float> ranks;
  
  ranks.m_ownsMemory = true;
  ranks.m_data = (float *)0x0;
  ranks.m_size = 0;
  ranks.m_capacity = 0;
  local_44 = 0.0;
  btAlignedObjectArray<float>::resize(&ranks,(this->m_nodes).m_size,&local_44);
  uVar1 = (this->m_nodes).m_size;
  pNVar2 = (this->m_nodes).m_data;
  uVar8 = 0;
  uVar7 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar7 = uVar8;
  }
  for (; uVar7 * 0x78 - uVar8 != 0; uVar8 = uVar8 + 0x78) {
    *(undefined4 *)((long)(&pNVar2->m_n + 1) + uVar8) = 0;
  }
  uVar1 = (this->m_tetras).m_size;
  pTVar3 = (this->m_tetras).m_data;
  pNVar2 = (this->m_nodes).m_data;
  uVar9 = 0;
  uVar8 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar8 = uVar9;
  }
  ppNVar10 = pTVar3->m_n;
  for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
    for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
      pNVar4 = ppNVar10[lVar11];
      pNVar4->m_im = ABS(pTVar3[uVar9].m_rv) + pNVar4->m_im;
      iVar5 = (int)(((long)pNVar4 - (long)pNVar2) / 0x78);
      ranks.m_data[iVar5] = ranks.m_data[iVar5] + 1.0;
    }
    ppNVar10 = ppNVar10 + 0x11;
  }
  pbVar6 = &((this->m_nodes).m_data)->m_im;
  for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    if (0.0 < *pbVar6) {
      *pbVar6 = ranks.m_data[uVar8] / *pbVar6;
    }
    pbVar6 = pbVar6 + 0x1e;
  }
  setTotalMass(this,mass,false);
  btAlignedObjectArray<float>::~btAlignedObjectArray(&ranks);
  return;
}

Assistant:

void			btSoftBody::setVolumeMass(btScalar mass)
{
btAlignedObjectArray<btScalar>	ranks;
ranks.resize(m_nodes.size(),0);
int i;

for(i=0;i<m_nodes.size();++i)
	{
	m_nodes[i].m_im=0;
	}
for(i=0;i<m_tetras.size();++i)
	{
	const Tetra& t=m_tetras[i];
	for(int j=0;j<4;++j)
		{
		t.m_n[j]->m_im+=btFabs(t.m_rv);
		ranks[int(t.m_n[j]-&m_nodes[0])]+=1;
		}
	}
for( i=0;i<m_nodes.size();++i)
	{
	if(m_nodes[i].m_im>0)
		{
		m_nodes[i].m_im=ranks[i]/m_nodes[i].m_im;
		}
	}
setTotalMass(mass,false);
}